

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Read(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  FILE *__stream;
  Gia_Man_t *pNew;
  char *pcVar5;
  uint fSkipStrash;
  uint fGiaSimple;
  char *pcVar6;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  bVar2 = false;
  bVar3 = false;
  fGiaSimple = 0;
  fSkipStrash = 0;
  while( true ) {
    while (iVar4 = Extra_UtilGetopt(argc,argv,"csmlvh"), iVar4 == 0x73) {
      fSkipStrash = fSkipStrash ^ 1;
    }
    if (iVar4 == -1) break;
    if (iVar4 == 0x76) {
      bVar3 = (bool)(bVar3 ^ 1);
    }
    else if (iVar4 == 0x6c) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    else if (iVar4 == 0x6d) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    else {
      if (iVar4 != 99) {
        iVar4 = -2;
        Abc_Print(-2,"usage: &r [-csmlvh] <file>\n");
        Abc_Print(-2,"\t         reads the current AIG from the AIGER file\n");
        pcVar6 = "yes";
        pcVar5 = "yes";
        if (fGiaSimple == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-c     : toggles reading simple AIG [default = %s]\n",pcVar5);
        pcVar5 = "no";
        if (fSkipStrash == 0) {
          pcVar5 = "yes";
        }
        Abc_Print(-2,"\t-s     : toggles structural hashing while reading [default = %s]\n",pcVar5);
        pcVar5 = "yes";
        if (!bVar1) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-m     : toggles reading MiniAIG rather than AIGER file [default = %s]\n",
                  pcVar5);
        pcVar5 = "yes";
        if (!bVar2) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-l     : toggles reading MiniLUT rather than AIGER file [default = %s]\n",
                  pcVar5);
        if (!bVar3) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-v     : toggles additional verbose output [default = %s]\n",pcVar6);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        pcVar5 = "\t<file> : the file name\n";
LAB_002454a6:
        Abc_Print(iVar4,pcVar5);
        return 1;
      }
      fGiaSimple = fGiaSimple ^ 1;
    }
  }
  if (argc - globalUtilOptind == 1) {
    pcVar5 = argv[globalUtilOptind];
    pcVar6 = pcVar5;
    do {
      if (*pcVar6 == '>') {
        *pcVar6 = '\\';
      }
      else if (*pcVar6 == '\0') {
        __stream = fopen(pcVar5,"r");
        if (__stream == (FILE *)0x0) {
          Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar5);
          pcVar5 = Extra_FileGetSimilarName(pcVar5,".aig",".blif",".pla",".eqn",".bench");
          if (pcVar5 != (char *)0x0) {
            Abc_Print(1,"Did you mean \"%s\"?",pcVar5);
          }
          Abc_Print(1,"\n");
          return 1;
        }
        fclose(__stream);
        if (bVar1) {
          pNew = Gia_ManReadMiniAig(pcVar5);
        }
        else if (bVar2) {
          pNew = Gia_ManReadMiniLut(pcVar5);
        }
        else {
          pNew = Gia_AigerRead(pcVar5,fGiaSimple,fSkipStrash,0);
        }
        if (pNew == (Gia_Man_t *)0x0) {
          return 0;
        }
        Abc_FrameUpdateGia(pAbc,pNew);
        return 0;
      }
      pcVar6 = pcVar6 + 1;
    } while( true );
  }
  pcVar5 = "There is no file name.\n";
  iVar4 = -1;
  goto LAB_002454a6;
}

Assistant:

int Abc_CommandAbc9Read( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc3_ReadShowHie( char * pFileName, int fFlat );
    Gia_Man_t * pAig = NULL;
    FILE * pFile;
    char ** pArgvNew;
    char * FileName, * pTemp;
    int c, nArgcNew;
    int fMiniAig = 0;
    int fMiniLut = 0;
    int fVerbose = 0;
    int fGiaSimple = 0;
    int fSkipStrash = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "csmlvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fGiaSimple ^= 1;
            break;
        case 's':
            fSkipStrash ^= 1;
            break;
        case 'm':
            fMiniAig ^= 1;
            break;
        case 'l':
            fMiniLut ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "There is no file name.\n" );
        return 1;
    }

    // get the input file name
    FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = FileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", ".blif", ".pla", ".eqn", ".bench" )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );

    if ( fMiniAig )
        pAig = Gia_ManReadMiniAig( FileName );
    else if ( fMiniLut )
        pAig = Gia_ManReadMiniLut( FileName );
//    else if ( Extra_FileIsType( FileName, ".v", NULL, NULL ) )
//        Abc3_ReadShowHie( FileName, fSkipStrash );
    else
        pAig = Gia_AigerRead( FileName, fGiaSimple, fSkipStrash, 0 );
    if ( pAig )
        Abc_FrameUpdateGia( pAbc, pAig );
    return 0;

usage:
    Abc_Print( -2, "usage: &r [-csmlvh] <file>\n" );
    Abc_Print( -2, "\t         reads the current AIG from the AIGER file\n" );
    Abc_Print( -2, "\t-c     : toggles reading simple AIG [default = %s]\n", fGiaSimple? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggles structural hashing while reading [default = %s]\n", !fSkipStrash? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggles reading MiniAIG rather than AIGER file [default = %s]\n", fMiniAig? "yes": "no" );
    Abc_Print( -2, "\t-l     : toggles reading MiniLUT rather than AIGER file [default = %s]\n", fMiniLut? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles additional verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : the file name\n");
    return 1;
}